

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memchr.c
# Opt level: O1

ssize_t mpt_memrchr(iovec *data,size_t ndat,int tok)

{
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  size_t in_RCX;
  size_t *psVar4;
  size_t sVar5;
  bool bVar6;
  
  do {
    sVar5 = ndat - 1;
    if (ndat == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      return -2;
    }
    sVar1 = data[sVar5].iov_len;
    do {
      sVar2 = sVar1;
      if (sVar2 == 0) goto LAB_00114779;
      sVar1 = sVar2 - 1;
    } while (*(char *)((long)data[sVar5].iov_base + (sVar2 - 1)) != (char)tok);
    psVar4 = &data[ndat - 2].iov_len;
    in_RCX = sVar2 - 1;
    do {
      bVar6 = sVar5 == 0;
      sVar5 = sVar5 - 1;
      if (bVar6) {
        sVar5 = 0;
        goto LAB_00114779;
      }
      in_RCX = in_RCX + *psVar4;
      psVar4 = psVar4 + -2;
    } while (-1 < (long)in_RCX);
    piVar3 = __errno_location();
    *piVar3 = 0x4b;
    in_RCX = 0xffffffffffffffff;
LAB_00114779:
    ndat = sVar5;
    if (sVar2 != 0) {
      return in_RCX;
    }
  } while( true );
}

Assistant:

extern ssize_t mpt_memrchr(const struct iovec *data, size_t ndat, int tok)
{
	size_t	i = ndat;
	
	while (i--) {
		const uint8_t match = tok, *tmp = ((uint8_t *) data[i].iov_base) + data[i].iov_len;
		
		ndat = data[i].iov_len;
		
		while (ndat--) {
			if (*(--tmp) == match) {
				while (i) {
					if ((ndat += data[--i].iov_len) > SSIZE_MAX) {
						errno = EOVERFLOW; return -1;
					}
				}
				return ndat;
			}
		}
	}
	
	errno = EAGAIN;
	
	return -2;
}